

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

If_Grp_t *
If_CluCheck3(If_Grp_t *__return_storage_ptr__,If_Man_t *p,word *pTruth0,int nVars,int nLutLeaf,
            int nLutLeaf2,int nLutRoot,If_Grp_t *pR,If_Grp_t *pG2,word *pFunc0,word *pFunc1,
            word *pFunc2)

{
  int iVar2;
  undefined8 uVar3;
  uint uVar4;
  undefined1 local_21b2 [16];
  char local_21a2 [2];
  undefined1 local_21a0 [16];
  char local_2190 [2];
  undefined1 local_218e [16];
  char local_217e [2];
  undefined4 local_217c;
  int local_2178;
  int Test;
  int iVar1;
  int iVar0;
  word Func2_1;
  word Func1_1;
  word Func0_1;
  int P2V [18];
  int local_2108 [2];
  int V2P [18];
  char cStack_20b8;
  char cStack_20b7;
  undefined1 local_20b6 [15];
  undefined1 auStack_20a7 [3];
  int i;
  If_Grp_t R2;
  If_Grp_t R;
  If_Grp_t G2;
  If_Grp_t G1;
  word Func2;
  word Func1;
  word Func0;
  word pLeftOver [1024];
  uint *pHashed;
  int fEnableHashing;
  int nLutLeaf2_local;
  int nLutLeaf_local;
  int nVars_local;
  word *pTruth0_local;
  If_Man_t *p_local;
  
  pLeftOver[0x3ff] = 0;
  memset(G2.pVars + 8,0,0x12);
  memset(R.pVars + 8,0,0x12);
  memset(R2.pVars + 8,0,0x12);
  memset(local_20b6 + 0xe,0,0x12);
  If_CluCheck3::Counter = If_CluCheck3::Counter + 1;
  s_Count3 = s_Count3 + 1;
  If_CluCheck((If_Grp_t *)((long)V2P + 0x42),p,pTruth0,nVars,0,0,nLutLeaf,nLutRoot + nLutLeaf2 + -1,
              (If_Grp_t *)(local_20b6 + 0xe),&Func1,&Func2,&Func0,0);
  G2.pVars[8] = V2P[0x10]._2_1_;
  G2.pVars[9] = V2P[0x10]._3_1_;
  G2.pVars[10] = (char)V2P[0x11];
  G2.pVars[0xb] = V2P[0x11]._1_1_;
  G2.pVars[0xc] = V2P[0x11]._2_1_;
  G2.pVars[0xd] = V2P[0x11]._3_1_;
  G2.pVars[0xe] = cStack_20b8;
  G2.pVars[0xf] = cStack_20b7;
  uVar3 = G2.pVars._8_8_;
  G1._0_8_ = local_20b6._0_8_;
  G1.pVars._6_2_ = local_20b6._8_2_;
  G2.pVars[8] = (char)stack0xffffffffffffdf42;
  G2.pVars._8_8_ = uVar3;
  if (G2.pVars[8] == '\0') {
    G2.pVars[9] = SUB81(stack0xffffffffffffdf42,1);
    if ((((G2.pVars[9] == '\x03') || (G2.pVars[9] == '\x04')) && (nLutLeaf == nLutLeaf2)) &&
       ((nVars - nLutLeaf) + 2 <= nLutRoot)) {
      G2.pVars._9_7_ = SUB87(stack0xffffffffffffdf42,1);
      G2.pVars[8] = (char)nLutLeaf;
      If_CluCopy(&Func0,pTruth0,nVars);
      for (local_20b6._10_4_ = 0; (int)local_20b6._10_4_ < nVars;
          local_20b6._10_4_ = local_20b6._10_4_ + 1) {
        P2V[(long)(int)local_20b6._10_4_ + -2] = local_20b6._10_4_;
        local_2108[(int)local_20b6._10_4_] = local_20b6._10_4_;
      }
      If_CluMoveGroupToMsb(&Func0,nVars,local_2108,(int *)&Func0_1,(If_Grp_t *)(G2.pVars + 8));
      If_CluDeriveDisjoint4
                (&Func0,nVars,local_2108,(int *)&Func0_1,(If_Grp_t *)(G2.pVars + 8),
                 (If_Grp_t *)(R2.pVars + 8),&Func2_1,(word *)&iVar1);
      for (local_20b6._10_4_ = 0; (int)local_20b6._10_4_ < (int)R2.pVars[8];
          local_20b6._10_4_ = local_20b6._10_4_ + 1) {
        P2V[(long)(int)local_20b6._10_4_ + -2] = local_20b6._10_4_;
        local_2108[(int)local_20b6._10_4_] = local_20b6._10_4_;
      }
      If_CluMoveVar(&Func0,(int)R2.pVars[8],local_2108,(int *)&Func0_1,R2.pVars[8] + -2,0);
      If_CluMoveVar(&Func0,(int)R2.pVars[8],local_2108,(int *)&Func0_1,R2.pVars[8] + -1,1);
      R2.pVars[10] = R2.pVars[(long)(R2.pVars[8] + -2) + 10];
      Test = (int)R2.pVars[10];
      R2.pVars[0xb] = R2.pVars[(long)(R2.pVars[8] + -1) + 10];
      local_2178 = (int)R2.pVars[0xb];
      iVar2 = (int)R2.pVars[8];
      while (local_20b6._10_4_ = iVar2 + -1, 1 < (int)local_20b6._10_4_) {
        R2.pVars[(long)(int)local_20b6._10_4_ + 10] = R2.pVars[(long)(iVar2 + -3) + 10];
        iVar2 = local_20b6._10_4_;
      }
      Func1_1 = Func0;
      If_CluVerify3(pTruth0,nVars,(If_Grp_t *)(G2.pVars + 8),(If_Grp_t *)(G2.pVars + 8),
                    (If_Grp_t *)(R2.pVars + 8),Func2_1,_iVar1,Func0);
      if ((pFunc1 != (word *)0x0) && (pFunc2 != (word *)0x0)) {
        *pFunc0 = Func1_1;
        *pFunc1 = Func2_1;
        *pFunc2 = _iVar1;
        pG2->nVars = G2.pVars[8];
        pG2->nMyu = G2.pVars[9];
        pG2->pVars[0] = G2.pVars[10];
        pG2->pVars[1] = G2.pVars[0xb];
        pG2->pVars[2] = G2.pVars[0xc];
        pG2->pVars[3] = G2.pVars[0xd];
        pG2->pVars[4] = G2.pVars[0xe];
        pG2->pVars[5] = G2.pVars[0xf];
        pG2->pVars[6] = G1.nVars;
        pG2->pVars[7] = G1.nMyu;
        pG2->pVars[8] = G1.pVars[0];
        pG2->pVars[9] = G1.pVars[1];
        pG2->pVars[10] = G1.pVars[2];
        pG2->pVars[0xb] = G1.pVars[3];
        pG2->pVars[0xc] = G1.pVars[4];
        pG2->pVars[0xd] = G1.pVars[5];
        *(undefined2 *)(pG2->pVars + 0xe) = G1.pVars._6_2_;
        pR->nVars = R2.pVars[8];
        pR->nMyu = R2.pVars[9];
        pR->pVars[0] = R2.pVars[10];
        pR->pVars[1] = R2.pVars[0xb];
        pR->pVars[2] = R2.pVars[0xc];
        pR->pVars[3] = R2.pVars[0xd];
        pR->pVars[4] = R2.pVars[0xe];
        pR->pVars[5] = R2.pVars[0xf];
        pR->pVars[6] = R.nVars;
        pR->pVars[7] = R.nMyu;
        pR->pVars[8] = R.pVars[0];
        pR->pVars[9] = R.pVars[1];
        pR->pVars[10] = R.pVars[2];
        pR->pVars[0xb] = R.pVars[3];
        pR->pVars[0xc] = R.pVars[4];
        pR->pVars[0xd] = R.pVars[5];
        *(undefined2 *)(pR->pVars + 0xe) = R.pVars._6_2_;
      }
      if (pLeftOver[0x3ff] != 0) {
        uVar4 = If_CluGrp2Uns((If_Grp_t *)(G2.pVars + 8));
        *(uint *)pLeftOver[0x3ff] = uVar4;
      }
      __return_storage_ptr__->nVars = G2.pVars[8];
      __return_storage_ptr__->nMyu = G2.pVars[9];
      __return_storage_ptr__->pVars[0] = G2.pVars[10];
      __return_storage_ptr__->pVars[1] = G2.pVars[0xb];
      __return_storage_ptr__->pVars[2] = G2.pVars[0xc];
      __return_storage_ptr__->pVars[3] = G2.pVars[0xd];
      __return_storage_ptr__->pVars[4] = G2.pVars[0xe];
      __return_storage_ptr__->pVars[5] = G2.pVars[0xf];
      __return_storage_ptr__->pVars[6] = G1.nVars;
      __return_storage_ptr__->pVars[7] = G1.nMyu;
      __return_storage_ptr__->pVars[8] = G1.pVars[0];
      __return_storage_ptr__->pVars[9] = G1.pVars[1];
      __return_storage_ptr__->pVars[10] = G1.pVars[2];
      __return_storage_ptr__->pVars[0xb] = G1.pVars[3];
      __return_storage_ptr__->pVars[0xc] = G1.pVars[4];
      __return_storage_ptr__->pVars[0xd] = G1.pVars[5];
      *(undefined2 *)(__return_storage_ptr__->pVars + 0xe) = G1.pVars._6_2_;
    }
    else {
      if (pLeftOver[0x3ff] != 0) {
        uVar4 = If_CluGrp2Uns((If_Grp_t *)(G2.pVars + 8));
        *(uint *)pLeftOver[0x3ff] = uVar4;
      }
      __return_storage_ptr__->nVars = G2.pVars[8];
      __return_storage_ptr__->nMyu = G2.pVars[9];
      __return_storage_ptr__->pVars[0] = G2.pVars[10];
      __return_storage_ptr__->pVars[1] = G2.pVars[0xb];
      __return_storage_ptr__->pVars[2] = G2.pVars[0xc];
      __return_storage_ptr__->pVars[3] = G2.pVars[0xd];
      __return_storage_ptr__->pVars[4] = G2.pVars[0xe];
      __return_storage_ptr__->pVars[5] = G2.pVars[0xf];
      __return_storage_ptr__->pVars[6] = G1.nVars;
      __return_storage_ptr__->pVars[7] = G1.nMyu;
      __return_storage_ptr__->pVars[8] = G1.pVars[0];
      __return_storage_ptr__->pVars[9] = G1.pVars[1];
      __return_storage_ptr__->pVars[10] = G1.pVars[2];
      __return_storage_ptr__->pVars[0xb] = G1.pVars[3];
      __return_storage_ptr__->pVars[0xc] = G1.pVars[4];
      __return_storage_ptr__->pVars[0xd] = G1.pVars[5];
      *(undefined2 *)(__return_storage_ptr__->pVars + 0xe) = G1.pVars._6_2_;
    }
  }
  else if (nLutRoot < local_20b6[0xe]) {
    G2.pVars[8] = V2P[0x10]._2_1_;
    G2.pVars[9] = V2P[0x10]._3_1_;
    G2.pVars[10] = (char)V2P[0x11];
    G2.pVars[0xb] = V2P[0x11]._1_1_;
    G2.pVars[0xc] = V2P[0x11]._2_1_;
    G2.pVars[0xd] = V2P[0x11]._3_1_;
    G2.pVars[0xe] = cStack_20b8;
    G2.pVars[0xf] = cStack_20b7;
    local_217c = 0;
    if (p->pPars->nStructType == 0) {
      If_CluCheck((If_Grp_t *)local_218e,p,&Func0,(int)local_20b6[0xe],0,0,nLutLeaf2,nLutRoot,
                  (If_Grp_t *)(R2.pVars + 8),&Func1,(word *)(G1.pVars + 8),(word *)0x0,0);
      R.pVars[8] = local_218e[0];
      R.pVars[9] = local_218e[1];
      R.pVars[10] = local_218e[2];
      R.pVars[0xb] = local_218e[3];
      R.pVars[0xc] = local_218e[4];
      R.pVars[0xd] = local_218e[5];
      R.pVars[0xe] = local_218e[6];
      R.pVars[0xf] = local_218e[7];
      G2.nVars = local_218e[8];
      G2.nMyu = local_218e[9];
      G2.pVars[0] = local_218e[10];
      G2.pVars[1] = local_218e[0xb];
      G2.pVars[2] = local_218e[0xc];
      G2.pVars[3] = local_218e[0xd];
      G2.pVars[4] = local_218e[0xe];
      G2.pVars[5] = local_218e[0xf];
      G2.pVars[6] = local_217e[0];
      G2.pVars[7] = local_217e[1];
    }
    else if (p->pPars->nStructType == 1) {
      If_CluCheck((If_Grp_t *)local_21a0,p,&Func0,(int)local_20b6[0xe],1,0,nLutLeaf2,nLutRoot,
                  (If_Grp_t *)(R2.pVars + 8),&Func1,(word *)(G1.pVars + 8),(word *)0x0,0);
      R.pVars[8] = local_21a0[0];
      R.pVars[9] = local_21a0[1];
      R.pVars[10] = local_21a0[2];
      R.pVars[0xb] = local_21a0[3];
      R.pVars[0xc] = local_21a0[4];
      R.pVars[0xd] = local_21a0[5];
      R.pVars[0xe] = local_21a0[6];
      R.pVars[0xf] = local_21a0[7];
      G2.nVars = local_21a0[8];
      G2.nMyu = local_21a0[9];
      G2.pVars[0] = local_21a0[10];
      G2.pVars[1] = local_21a0[0xb];
      G2.pVars[2] = local_21a0[0xc];
      G2.pVars[3] = local_21a0[0xd];
      G2.pVars[4] = local_21a0[0xe];
      G2.pVars[5] = local_21a0[0xf];
      G2.pVars[6] = local_2190[0];
      G2.pVars[7] = local_2190[1];
    }
    else {
      if (p->pPars->nStructType != 2) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                      ,0x7ec,
                      "If_Grp_t If_CluCheck3(If_Man_t *, word *, int, int, int, int, If_Grp_t *, If_Grp_t *, word *, word *, word *)"
                     );
      }
      If_CluCheck((If_Grp_t *)local_21b2,p,&Func0,(int)local_20b6[0xe],0,1,nLutLeaf2,nLutRoot,
                  (If_Grp_t *)(R2.pVars + 8),&Func1,(word *)(G1.pVars + 8),(word *)0x0,0);
      R.pVars[8] = local_21b2[0];
      R.pVars[9] = local_21b2[1];
      R.pVars[10] = local_21b2[2];
      R.pVars[0xb] = local_21b2[3];
      R.pVars[0xc] = local_21b2[4];
      R.pVars[0xd] = local_21b2[5];
      R.pVars[0xe] = local_21b2[6];
      R.pVars[0xf] = local_21b2[7];
      G2.nVars = local_21b2[8];
      G2.nMyu = local_21b2[9];
      G2.pVars[0] = local_21b2[10];
      G2.pVars[1] = local_21b2[0xb];
      G2.pVars[2] = local_21b2[0xc];
      G2.pVars[3] = local_21b2[0xd];
      G2.pVars[4] = local_21b2[0xe];
      G2.pVars[5] = local_21b2[0xf];
      G2.pVars[6] = local_21a2[0];
      G2.pVars[7] = local_21a2[1];
    }
    if (R.pVars[8] == '\0') {
      if (pLeftOver[0x3ff] != 0) {
        uVar4 = If_CluGrp2Uns((If_Grp_t *)(R.pVars + 8));
        *(uint *)pLeftOver[0x3ff] = uVar4;
      }
      __return_storage_ptr__->nVars = R.pVars[8];
      __return_storage_ptr__->nMyu = R.pVars[9];
      __return_storage_ptr__->pVars[0] = R.pVars[10];
      __return_storage_ptr__->pVars[1] = R.pVars[0xb];
      __return_storage_ptr__->pVars[2] = R.pVars[0xc];
      __return_storage_ptr__->pVars[3] = R.pVars[0xd];
      __return_storage_ptr__->pVars[4] = R.pVars[0xe];
      __return_storage_ptr__->pVars[5] = R.pVars[0xf];
      __return_storage_ptr__->pVars[6] = G2.nVars;
      __return_storage_ptr__->pVars[7] = G2.nMyu;
      __return_storage_ptr__->pVars[8] = G2.pVars[0];
      __return_storage_ptr__->pVars[9] = G2.pVars[1];
      __return_storage_ptr__->pVars[10] = G2.pVars[2];
      __return_storage_ptr__->pVars[0xb] = G2.pVars[3];
      __return_storage_ptr__->pVars[0xc] = G2.pVars[4];
      __return_storage_ptr__->pVars[0xd] = G2.pVars[5];
      *(undefined2 *)(__return_storage_ptr__->pVars + 0xe) = G2.pVars._6_2_;
    }
    else {
      for (local_20b6._10_4_ = 0; (int)local_20b6._10_4_ < (int)R.pVars[8];
          local_20b6._10_4_ = local_20b6._10_4_ + 1) {
        if (local_20b6[0xe] <= R.pVars[(long)(int)local_20b6._10_4_ + 10]) {
          __assert_fail("G2.pVars[i] < R2.nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                        ,0x7f7,
                        "If_Grp_t If_CluCheck3(If_Man_t *, word *, int, int, int, int, If_Grp_t *, If_Grp_t *, word *, word *, word *)"
                       );
        }
        R.pVars[(long)(int)local_20b6._10_4_ + 10] =
             auStack_20a7[(long)(int)R.pVars[(long)(int)local_20b6._10_4_ + 10] + 1];
      }
      for (local_20b6._10_4_ = 0; (int)local_20b6._10_4_ < (int)R2.pVars[8];
          local_20b6._10_4_ = local_20b6._10_4_ + 1) {
        if (R2.pVars[(long)(int)local_20b6._10_4_ + 10] == local_20b6[0xe]) {
          R2.pVars[(long)(int)local_20b6._10_4_ + 10] = (char)nVars + '\x01';
        }
        else {
          R2.pVars[(long)(int)local_20b6._10_4_ + 10] =
               auStack_20a7[(long)(int)R2.pVars[(long)(int)local_20b6._10_4_ + 10] + 1];
        }
      }
      if (pG2 != (If_Grp_t *)0x0) {
        pG2->nVars = R.pVars[8];
        pG2->nMyu = R.pVars[9];
        pG2->pVars[0] = R.pVars[10];
        pG2->pVars[1] = R.pVars[0xb];
        pG2->pVars[2] = R.pVars[0xc];
        pG2->pVars[3] = R.pVars[0xd];
        pG2->pVars[4] = R.pVars[0xe];
        pG2->pVars[5] = R.pVars[0xf];
        pG2->pVars[6] = G2.nVars;
        pG2->pVars[7] = G2.nMyu;
        pG2->pVars[8] = G2.pVars[0];
        pG2->pVars[9] = G2.pVars[1];
        pG2->pVars[10] = G2.pVars[2];
        pG2->pVars[0xb] = G2.pVars[3];
        pG2->pVars[0xc] = G2.pVars[4];
        pG2->pVars[0xd] = G2.pVars[5];
        *(undefined2 *)(pG2->pVars + 0xe) = G2.pVars._6_2_;
      }
      if (pR != (If_Grp_t *)0x0) {
        pR->nVars = R2.pVars[8];
        pR->nMyu = R2.pVars[9];
        pR->pVars[0] = R2.pVars[10];
        pR->pVars[1] = R2.pVars[0xb];
        pR->pVars[2] = R2.pVars[0xc];
        pR->pVars[3] = R2.pVars[0xd];
        pR->pVars[4] = R2.pVars[0xe];
        pR->pVars[5] = R2.pVars[0xf];
        pR->pVars[6] = R.nVars;
        pR->pVars[7] = R.nMyu;
        pR->pVars[8] = R.pVars[0];
        pR->pVars[9] = R.pVars[1];
        pR->pVars[10] = R.pVars[2];
        pR->pVars[0xb] = R.pVars[3];
        pR->pVars[0xc] = R.pVars[4];
        pR->pVars[0xd] = R.pVars[5];
        *(undefined2 *)(pR->pVars + 0xe) = R.pVars._6_2_;
      }
      if (pFunc0 != (word *)0x0) {
        *pFunc0 = Func1;
      }
      if (pFunc1 != (word *)0x0) {
        *pFunc1 = Func2;
      }
      if (pFunc2 != (word *)0x0) {
        *pFunc2 = G1.pVars._8_8_;
      }
      if (pLeftOver[0x3ff] != 0) {
        uVar4 = If_CluGrp2Uns((If_Grp_t *)(G2.pVars + 8));
        *(uint *)pLeftOver[0x3ff] = uVar4;
      }
      __return_storage_ptr__->nVars = G2.pVars[8];
      __return_storage_ptr__->nMyu = G2.pVars[9];
      __return_storage_ptr__->pVars[0] = G2.pVars[10];
      __return_storage_ptr__->pVars[1] = G2.pVars[0xb];
      __return_storage_ptr__->pVars[2] = G2.pVars[0xc];
      __return_storage_ptr__->pVars[3] = G2.pVars[0xd];
      __return_storage_ptr__->pVars[4] = G2.pVars[0xe];
      __return_storage_ptr__->pVars[5] = G2.pVars[0xf];
      __return_storage_ptr__->pVars[6] = G1.nVars;
      __return_storage_ptr__->pVars[7] = G1.nMyu;
      __return_storage_ptr__->pVars[8] = G1.pVars[0];
      __return_storage_ptr__->pVars[9] = G1.pVars[1];
      __return_storage_ptr__->pVars[10] = G1.pVars[2];
      __return_storage_ptr__->pVars[0xb] = G1.pVars[3];
      __return_storage_ptr__->pVars[0xc] = G1.pVars[4];
      __return_storage_ptr__->pVars[0xd] = G1.pVars[5];
      *(undefined2 *)(__return_storage_ptr__->pVars + 0xe) = G1.pVars._6_2_;
    }
  }
  else {
    if (pG2 != (If_Grp_t *)0x0) {
      pG2->nVars = R.pVars[8];
      pG2->nMyu = R.pVars[9];
      pG2->pVars[0] = R.pVars[10];
      pG2->pVars[1] = R.pVars[0xb];
      pG2->pVars[2] = R.pVars[0xc];
      pG2->pVars[3] = R.pVars[0xd];
      pG2->pVars[4] = R.pVars[0xe];
      pG2->pVars[5] = R.pVars[0xf];
      pG2->pVars[6] = G2.nVars;
      pG2->pVars[7] = G2.nMyu;
      pG2->pVars[8] = G2.pVars[0];
      pG2->pVars[9] = G2.pVars[1];
      pG2->pVars[10] = G2.pVars[2];
      pG2->pVars[0xb] = G2.pVars[3];
      pG2->pVars[0xc] = G2.pVars[4];
      pG2->pVars[0xd] = G2.pVars[5];
      *(undefined2 *)(pG2->pVars + 0xe) = G2.pVars._6_2_;
    }
    if (pR != (If_Grp_t *)0x0) {
      pR->nVars = local_20b6[0xe];
      pR->nMyu = (char)_auStack_20a7;
      pR->pVars[0] = (char)((uint7)_auStack_20a7 >> 8);
      pR->pVars[1] = (char)((uint7)_auStack_20a7 >> 0x10);
      pR->pVars[2] = (char)((uint7)_auStack_20a7 >> 0x18);
      pR->pVars[3] = (char)((uint7)_auStack_20a7 >> 0x20);
      pR->pVars[4] = (char)((uint7)_auStack_20a7 >> 0x28);
      pR->pVars[5] = (char)((uint7)_auStack_20a7 >> 0x30);
      pR->pVars[6] = R2.nVars;
      pR->pVars[7] = R2.nMyu;
      pR->pVars[8] = R2.pVars[0];
      pR->pVars[9] = R2.pVars[1];
      pR->pVars[10] = R2.pVars[2];
      pR->pVars[0xb] = R2.pVars[3];
      pR->pVars[0xc] = R2.pVars[4];
      pR->pVars[0xd] = R2.pVars[5];
      *(undefined2 *)(pR->pVars + 0xe) = R2.pVars._6_2_;
    }
    if (pFunc0 != (word *)0x0) {
      *pFunc0 = Func1;
    }
    if (pFunc1 != (word *)0x0) {
      *pFunc1 = Func2;
    }
    if (pFunc2 != (word *)0x0) {
      *pFunc2 = 0;
    }
    if (pLeftOver[0x3ff] != 0) {
      uVar4 = If_CluGrp2Uns((If_Grp_t *)(G2.pVars + 8));
      *(uint *)pLeftOver[0x3ff] = uVar4;
    }
    __return_storage_ptr__->nVars = G2.pVars[8];
    __return_storage_ptr__->nMyu = G2.pVars[9];
    __return_storage_ptr__->pVars[0] = G2.pVars[10];
    __return_storage_ptr__->pVars[1] = G2.pVars[0xb];
    __return_storage_ptr__->pVars[2] = G2.pVars[0xc];
    __return_storage_ptr__->pVars[3] = G2.pVars[0xd];
    __return_storage_ptr__->pVars[4] = G2.pVars[0xe];
    __return_storage_ptr__->pVars[5] = G2.pVars[0xf];
    __return_storage_ptr__->pVars[6] = G1.nVars;
    __return_storage_ptr__->pVars[7] = G1.nMyu;
    __return_storage_ptr__->pVars[8] = G1.pVars[0];
    __return_storage_ptr__->pVars[9] = G1.pVars[1];
    __return_storage_ptr__->pVars[10] = G1.pVars[2];
    __return_storage_ptr__->pVars[0xb] = G1.pVars[3];
    __return_storage_ptr__->pVars[0xc] = G1.pVars[4];
    __return_storage_ptr__->pVars[0xd] = G1.pVars[5];
    *(undefined2 *)(__return_storage_ptr__->pVars + 0xe) = G1.pVars._6_2_;
  }
  return __return_storage_ptr__;
}

Assistant:

If_Grp_t If_CluCheck3( If_Man_t * p, word * pTruth0, int nVars, int nLutLeaf, int nLutLeaf2, int nLutRoot, 
                      If_Grp_t * pR, If_Grp_t * pG2, word * pFunc0, word * pFunc1, word * pFunc2 )
{
    int fEnableHashing = 0;
    static int Counter = 0;
    unsigned * pHashed = NULL;
    word pLeftOver[CLU_WRD_MAX], Func0, Func1, Func2;
    If_Grp_t G1 = {0}, G2 = {0}, R = {0}, R2 = {0};
    int i;
    Counter++;
//    if ( Counter == 37590 )
//    {
//        int ns = 0;
//    }

    // check hash table
    if ( p && fEnableHashing )
    {
        pHashed = If_CluHashLookup( p, pTruth0, 1 );
        if ( pHashed && *pHashed != CLU_UNUSED )
        {
            If_CluUns2Grp( *pHashed, &G1 );
            return G1;
        }
    }
    s_Count3++;

    // check two-node decomposition
    G1 = If_CluCheck( p, pTruth0, nVars, 0, 0, nLutLeaf, nLutRoot + nLutLeaf2 - 1, &R2, &Func0, &Func1, pLeftOver, 0 );
    // decomposition does not exist
    if ( G1.nVars == 0 )
    {
        // check for decomposition with two outputs
        if ( (G1.nMyu == 3 || G1.nMyu == 4) && nLutLeaf == nLutLeaf2 && nVars - nLutLeaf + 2 <= nLutRoot )
        {
            int V2P[CLU_VAR_MAX+2], P2V[CLU_VAR_MAX+2];
            word Func0, Func1, Func2;
            int iVar0, iVar1;

            G1.nVars = nLutLeaf;
            If_CluCopy( pLeftOver, pTruth0, nVars );
            for ( i = 0; i < nVars; i++ )
                V2P[i] = P2V[i] = i;

            If_CluMoveGroupToMsb( pLeftOver, nVars, V2P, P2V, &G1 );
            If_CluDeriveDisjoint4( pLeftOver, nVars, V2P, P2V, &G1, &R, &Func1, &Func2 );

            // move the two vars to the front
            for ( i = 0; i < R.nVars; i++ )
                V2P[i] = P2V[i] = i;
            If_CluMoveVar( pLeftOver, R.nVars, V2P, P2V, R.nVars-2, 0 );
            If_CluMoveVar( pLeftOver, R.nVars, V2P, P2V, R.nVars-1, 1 );
            iVar0 = R.pVars[R.nVars-2];
            iVar1 = R.pVars[R.nVars-1];
            for ( i = R.nVars-1; i > 1; i-- )
                R.pVars[i] = R.pVars[i-2];
            R.pVars[0] = iVar0;
            R.pVars[1] = iVar1;

            Func0 = pLeftOver[0];
            If_CluVerify3( pTruth0, nVars, &G1, &G1, &R, Func1, Func2, Func0 );
            if ( pFunc1 && pFunc2 )
            {
                *pFunc0 = Func0;
                *pFunc1 = Func1;
                *pFunc2 = Func2;
                *pG2 = G1;
                *pR = R;
            }

            if ( pHashed )
                *pHashed = If_CluGrp2Uns( &G1 );
//                Kit_DsdPrintFromTruth( (unsigned*)pTruth0, nVars );  printf( "\n" );
//                If_CluPrintGroup( &G1 );
            return G1;
        }

/*
//        if ( nVars == 6 )
        {
//            Extra_PrintHex( stdout, (unsigned *)pTruth0, nVars );  printf( "    " );
            Kit_DsdPrintFromTruth( (unsigned*)pTruth0, nVars );  printf( "\n" );
            if ( p != NULL )
            If_CluCheck3( NULL, pTruth0, nVars, nLutLeaf, nLutLeaf2, nLutRoot, pR, pG2, pFunc0, pFunc1, pFunc2 );
        } 
*/
        if ( pHashed )
            *pHashed = If_CluGrp2Uns( &G1 );
        return G1;
    }
    // decomposition exists and sufficient
    if ( R2.nVars <= nLutRoot )
    {
        if ( pG2 )     *pG2 = G2;
        if ( pR )      *pR  = R2;
        if ( pFunc0 )  *pFunc0 = Func0;
        if ( pFunc1 )  *pFunc1 = Func1;
        if ( pFunc2 )  *pFunc2 = 0;
        if ( pHashed )
            *pHashed = If_CluGrp2Uns( &G1 );
        return G1;
    }

    // try second decomposition
    {
        int Test = 0;
        if ( Test )
        {
            Kit_DsdPrintFromTruth( (unsigned*)&pLeftOver, R2.nVars ); printf( "\n" );
        }
    }

    // the new variable is at the bottom - skip it (iVarStart = 1)
    if ( p->pPars->nStructType == 0 ) // allowed
        G2 = If_CluCheck( p, pLeftOver, R2.nVars, 0, 0, nLutLeaf2, nLutRoot, &R, &Func0, &Func2, NULL, 0 );
    else if ( p->pPars->nStructType == 1 ) // not allowed
        G2 = If_CluCheck( p, pLeftOver, R2.nVars, 1, 0, nLutLeaf2, nLutRoot, &R, &Func0, &Func2, NULL, 0 );
    else if ( p->pPars->nStructType == 2 ) // required
        G2 = If_CluCheck( p, pLeftOver, R2.nVars, 0, 1, nLutLeaf2, nLutRoot, &R, &Func0, &Func2, NULL, 0 );
    else assert( 0 );

    if ( G2.nVars == 0 )
    {
        if ( pHashed )
            *pHashed = If_CluGrp2Uns( &G2 );
        return G2;
    }
    // remap variables
    for ( i = 0; i < G2.nVars; i++ )
    {
        assert( G2.pVars[i] < R2.nVars );
        G2.pVars[i] = R2.pVars[ (int)G2.pVars[i] ];
    }
    // remap variables
    for ( i = 0; i < R.nVars; i++ )
    {
        if ( R.pVars[i] == R2.nVars )
            R.pVars[i] = nVars + 1;
        else
            R.pVars[i] = R2.pVars[ (int)R.pVars[i] ];
    }

    // decomposition exist
    if ( pG2 )     *pG2 = G2;
    if ( pR )      *pR  = R;
    if ( pFunc0 )  *pFunc0 = Func0;
    if ( pFunc1 )  *pFunc1 = Func1;
    if ( pFunc2 )  *pFunc2 = Func2;
    if ( pHashed )
        *pHashed = If_CluGrp2Uns( &G1 );

    // verify
//    If_CluVerify3( pTruth0, nVars, &G1, &G2, &R, Func1, Func2, Func0 );
    return G1;
}